

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Impl::loadFinal(Impl *this,SchemaLoader *loader,uint64_t id)

{
  Node *in_RAX;
  LazyLoadCallback local_18;
  
  local_18._vptr_LazyLoadCallback = (_func_int **)in_RAX;
  findNode((Impl *)&stack0xffffffffffffffe8,(uint64_t)this);
  if ((Node *)local_18._vptr_LazyLoadCallback != (Node *)0x0) {
    Node::loadFinalSchema((Node *)local_18._vptr_LazyLoadCallback,loader);
    return;
  }
  return;
}

Assistant:

void Compiler::Impl::loadFinal(const SchemaLoader& loader, uint64_t id) {
  KJ_IF_SOME(node, findNode(id)) {
    node.loadFinalSchema(loader);
  }
}